

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O1

void __thiscall
nonius::standard_reporter::do_benchmark_failure(standard_reporter *this,exception_ptr *eptr)

{
  ostream *poVar1;
  basic_ostream<char,_std::char_traits<char>_> *pbVar2;
  void *local_20;
  
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,(this->current)._M_dataplus._M_p,
                      (this->current)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," failed to run successfully\n",0x1c);
  if (this->summary == false) {
    local_20 = eptr->_M_exception_object;
    if (local_20 != (void *)0x0) {
      std::__exception_ptr::exception_ptr::_M_addref();
    }
    std::rethrow_exception((exception_ptr)&local_20);
  }
  else if ((this->super_reporter).os.super__Function_base._M_manager != (_Manager_type)0x0) {
    pbVar2 = (*(this->super_reporter).os._M_invoker)((_Any_data *)&(this->super_reporter).os);
    std::__ostream_insert<char,std::char_traits<char>>(pbVar2,"\nbenchmark aborted\n",0x13);
    return;
  }
  std::__throw_bad_function_call();
}

Assistant:

void do_benchmark_failure(std::exception_ptr eptr) override {
            error_stream() << current << " failed to run successfully\n";
            if(!summary) {
                try {
                    std::rethrow_exception(eptr);
                } catch(std::exception& ex) {
                    error_stream() << "error: " << ex.what();
                } catch(...) {
                    error_stream() << "unknown error";
                }
            }
            report_stream() << "\nbenchmark aborted\n";
        }